

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

string * __thiscall
tinyobj::parseString_abi_cxx11_(string *__return_storage_ptr__,tinyobj *this,char **token)

{
  size_t sVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar2 = *(char **)this;
  sVar1 = strspn(pcVar2," \t");
  pcVar2 = pcVar2 + sVar1;
  *(char **)this = pcVar2;
  sVar1 = strcspn(pcVar2," \t\r");
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,pcVar2,pcVar2 + sVar1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (__return_storage_ptr__,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  *(size_t *)this = *(long *)this + sVar1;
  return __return_storage_ptr__;
}

Assistant:

static inline std::string parseString(const char **token) {
  std::string s;
  (*token) += strspn((*token), " \t");
  size_t e = strcspn((*token), " \t\r");
  s = std::string((*token), &(*token)[e]);
  (*token) += e;
  return s;
}